

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O1

void __thiscall SymbolTable::finalize(SymbolTable *this,u8 zeroTerminated)

{
  u64 uVar1;
  ulong uVar2;
  u32 i;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  ushort uVar7;
  u32 k;
  ulong uVar8;
  byte bVar9;
  u64 *puVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  byte local_160;
  u8 local_15f;
  byte local_15e [6];
  ulong local_158;
  ulong local_150;
  ulong local_148;
  u64 *local_140;
  byte local_138 [192];
  u8 rsum [8];
  
  uVar7 = this->nSymbols;
  local_158 = (ulong)uVar7;
  local_160 = ((char)uVar7 + zeroTerminated) - (char)this->lenHisto[0];
  local_15f = zeroTerminated;
  lVar4 = 0;
  bVar6 = zeroTerminated;
  do {
    bVar6 = bVar6 + (char)this->lenHisto[lVar4 + 1];
    local_15e[lVar4] = bVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  uVar11 = (ulong)zeroTerminated;
  this->suffixLim = (ushort)zeroTerminated;
  local_138[0] = 0;
  uVar1 = this->symbols[0x100].icl;
  this->symbols[0].val = this->symbols[0x100].val;
  this->symbols[0].icl = uVar1;
  if (zeroTerminated <= uVar7 && uVar7 != zeroTerminated) {
    local_150 = (ulong)this->suffixLim;
    local_140 = &this->symbols[0x100].icl;
    uVar5 = 0xffffffff0000000;
    local_148 = 0xffffffff0000000;
    bVar6 = local_15e[0];
    do {
      uVar1 = this->symbols[uVar11 + 0x100].val.num;
      uVar2 = this->symbols[uVar11 + 0x100].icl;
      iVar12 = (int)(uVar2 >> 0x1c);
      if ((uVar2 & uVar5) == 0x20000000) {
        uVar8 = 0;
        uVar5 = local_158;
        puVar10 = local_140;
        do {
          bVar13 = uVar11 == uVar8;
          bVar14 = (*puVar10 & 0xfffffffe0000000) == 0;
          bVar15 = (short)uVar1 != (short)(((Symbol *)(puVar10 + -1))->val).num;
          uVar5 = uVar5 & 0xffffffff;
          if ((!bVar15 && !bVar13) && !bVar14) {
            uVar5 = 0;
          }
          uVar8 = uVar8 + 1;
          puVar10 = puVar10 + 2;
        } while (uVar8 < uVar5);
        uVar5 = local_148;
        if ((bVar15 || bVar13) || bVar14) {
          bVar9 = (byte)local_150;
          uVar3 = (int)local_150 + 1;
          this->suffixLim = (u16)uVar3;
          local_150 = (ulong)uVar3;
        }
        else {
          bVar9 = bVar6 - 1;
          bVar6 = bVar9;
        }
      }
      else {
        uVar3 = iVar12 - 1;
        bVar9 = (&local_160)[uVar3];
        (&local_160)[uVar3] = bVar9 + 1;
      }
      local_138[uVar11] = bVar9;
      this->symbols[bVar9].val.num = uVar1;
      this->symbols[bVar9].icl =
           (ulong)(iVar12 * -8 + 0x40U | (uint)bVar9 << 0x10 | (uint)uVar2 & 0xf0000000);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
  lVar4 = 0;
  do {
    uVar7 = 0x11ff;
    if ((this->byteCodes[lVar4] >> 8 & 1) != 0) {
      uVar7 = local_138[(ulong)this->byteCodes[lVar4] & 0xff] | 0x1000;
    }
    this->byteCodes[lVar4] = uVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  uVar11 = 0;
  do {
    uVar7 = this->shortCodes[uVar11];
    if ((uVar7 >> 8 & 1) == 0) {
      uVar7 = this->byteCodes[uVar11 & 0xff];
    }
    else {
      uVar7 = uVar7 & 0xf000 | (ushort)local_138[(byte)uVar7];
    }
    this->shortCodes[uVar11] = uVar7;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x10000);
  lVar4 = 0;
  do {
    uVar11 = *(ulong *)((long)&this->hashTab[0].icl + lVar4);
    if (uVar11 < 0xf1ff0000) {
      puVar10 = (u64 *)((long)&this->hashTab[0].icl + lVar4);
      uVar1 = this->symbols[local_138[uVar11 >> 0x10 & 0xff]].icl;
      *(anon_union_8_2_43acef4c_for_val *)(puVar10 + -1) =
           this->symbols[local_138[uVar11 >> 0x10 & 0xff]].val;
      *puVar10 = uVar1;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x4000);
  return;
}

Assistant:

void finalize(u8 zeroTerminated) {
       assert(nSymbols <= 255);
       u8 newCode[256], rsum[8], byteLim = nSymbols - (lenHisto[0] - zeroTerminated);

       // compute running sum of code lengths (starting offsets for each length) 
       rsum[0] = byteLim; // 1-byte codes are highest
       rsum[1] = zeroTerminated;
       for(u32 i=1; i<7; i++)
          rsum[i+1] = rsum[i] + lenHisto[i];

       // determine the new code for each symbol, ordered by length (and splitting 2byte symbols into two classes around suffixLim)
       suffixLim = rsum[1];
       symbols[newCode[0] = 0] = symbols[256]; // keep symbol 0 in place (for zeroTerminated cases only)

       for(u32 i=zeroTerminated, j=rsum[2]; i<nSymbols; i++) {  
          Symbol s1 = symbols[FSST_CODE_BASE+i];
          u32 len = s1.length(), opt = (len == 2)*nSymbols;
          if (opt) {
              u16 first2 = s1.first2();
              for(u32 k=0; k<opt; k++) {  
                 Symbol s2 = symbols[FSST_CODE_BASE+k];
                 if (k != i && s2.length() > 1 && first2 == s2.first2()) // test if symbol k is a suffix of s
                    opt = 0;
              }
              newCode[i] = opt?suffixLim++:--j; // symbols without a larger suffix have a code < suffixLim 
          } else 
              newCode[i] = rsum[len-1]++;
          s1.set_code_len(newCode[i],len);
          symbols[newCode[i]] = s1; 
       }
       // renumber the codes in byteCodes[] 
       for(u32 i=0; i<256; i++) 
          if ((byteCodes[i] & FSST_CODE_MASK) >= FSST_CODE_BASE)
             byteCodes[i] = newCode[(u8) byteCodes[i]] + (1 << FSST_LEN_BITS);
          else 
             byteCodes[i] = 511 + (1 << FSST_LEN_BITS);
       
       // renumber the codes in shortCodes[] 
       for(u32 i=0; i<65536; i++)
          if ((shortCodes[i] & FSST_CODE_MASK) >= FSST_CODE_BASE)
             shortCodes[i] = newCode[(u8) shortCodes[i]] + (shortCodes[i] & (15 << FSST_LEN_BITS));
          else 
             shortCodes[i] = byteCodes[i&0xFF];

       // replace the symbols in the hash table
       for(u32 i=0; i<hashTabSize; i++)
          if (hashTab[i].icl < FSST_ICL_FREE)
             hashTab[i] = symbols[newCode[(u8) hashTab[i].code()]];
   }